

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O0

int TIFFReadCustomDirectory(TIFF *tif,toff_t diroff,TIFFFieldArray *infoarray)

{
  toff_t tif_00;
  int iVar1;
  TIFFField *info;
  bool bVar2;
  uint32_t local_58;
  uint32_t local_54;
  uint32_t expected;
  uint32_t fii;
  TIFFField *fip;
  TIFFDirEntry *pTStack_40;
  uint16_t di;
  TIFFDirEntry *dp;
  TIFFDirEntry *pTStack_30;
  uint16_t dircount;
  TIFFDirEntry *dir;
  TIFFFieldArray *infoarray_local;
  toff_t diroff_local;
  TIFF *tif_local;
  
  dir = (TIFFDirEntry *)infoarray;
  infoarray_local = (TIFFFieldArray *)diroff;
  diroff_local = (toff_t)tif;
  (*tif->tif_cleanup)(tif);
  _TIFFSetupFields((TIFF *)diroff_local,(TIFFFieldArray *)dir);
  dp._6_2_ = TIFFFetchDirectory((TIFF *)diroff_local,(uint64_t)infoarray_local,
                                &stack0xffffffffffffffd0,(uint64_t *)0x0);
  if (dp._6_2_ == 0) {
    TIFFErrorExtR((TIFF *)diroff_local,"TIFFReadCustomDirectory",
                  "Failed to read custom directory at offset %lu",infoarray_local);
    tif_local._4_4_ = 0;
  }
  else {
    TIFFFreeDirectory((TIFF *)diroff_local);
    _TIFFmemset((void *)(diroff_local + 0x48),0,0x158);
    TIFFReadDirectoryCheckOrder((TIFF *)diroff_local,pTStack_30,dp._6_2_);
    pTStack_40 = pTStack_30;
    for (fip._6_2_ = 0; fip._6_2_ < dp._6_2_; fip._6_2_ = fip._6_2_ + 1) {
      TIFFReadDirectoryFindFieldInfo((TIFF *)diroff_local,pTStack_40->tdir_tag,&local_54);
      if (local_54 == 0xffffffff) {
        TIFFWarningExtR((TIFF *)diroff_local,"TIFFReadCustomDirectory",
                        "Unknown field with tag %u (0x%x) encountered",(ulong)pTStack_40->tdir_tag,
                        (ulong)pTStack_40->tdir_tag);
        tif_00 = diroff_local;
        info = _TIFFCreateAnonField
                         ((TIFF *)diroff_local,(uint)pTStack_40->tdir_tag,
                          (uint)pTStack_40->tdir_type);
        iVar1 = _TIFFMergeFields((TIFF *)tif_00,info,1);
        if (iVar1 == 0) {
          TIFFWarningExtR((TIFF *)diroff_local,"TIFFReadCustomDirectory",
                          "Registering anonymous field with tag %u (0x%x) failed",
                          (ulong)pTStack_40->tdir_tag,(ulong)pTStack_40->tdir_tag);
          pTStack_40->tdir_ignore = '\x01';
        }
        else {
          TIFFReadDirectoryFindFieldInfo((TIFF *)diroff_local,pTStack_40->tdir_tag,&local_54);
          if (local_54 == 0xffffffff) {
            __assert_fail("fii != FAILED_FII",
                          "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                          ,0x1424,
                          "int TIFFReadCustomDirectory(TIFF *, toff_t, const TIFFFieldArray *)");
          }
        }
      }
      if (pTStack_40->tdir_ignore == '\0') {
        _expected = *(TIFFField **)(*(long *)(diroff_local + 0x488) + (ulong)local_54 * 8);
        if (_expected->field_bit == 0) {
          pTStack_40->tdir_ignore = '\x01';
        }
        else {
          while( true ) {
            bVar2 = false;
            if (_expected->field_type != TIFF_NOTYPE) {
              bVar2 = _expected->field_type != (uint)pTStack_40->tdir_type;
            }
            if (!bVar2) goto LAB_003c0f4f;
            local_54 = local_54 + 1;
            if (((ulong)local_54 == *(ulong *)(diroff_local + 0x490)) ||
               (**(uint **)(*(long *)(diroff_local + 0x488) + (ulong)local_54 * 8) !=
                (uint)pTStack_40->tdir_tag)) break;
            _expected = *(TIFFField **)(*(long *)(diroff_local + 0x488) + (ulong)local_54 * 8);
          }
          local_54 = 0xffff;
LAB_003c0f4f:
          if (local_54 == 0xffff) {
            TIFFWarningExtR((TIFF *)diroff_local,"TIFFReadCustomDirectory",
                            "Wrong data type %u for \"%s\"; tag ignored",
                            (ulong)pTStack_40->tdir_type,_expected->field_name);
            pTStack_40->tdir_ignore = '\x01';
          }
          else if ((_expected->field_readcount != -1) && (_expected->field_readcount != -3)) {
            if (_expected->field_readcount == -2) {
              local_58 = (uint32_t)*(ushort *)(diroff_local + 0x82);
            }
            else {
              local_58 = (uint32_t)_expected->field_readcount;
            }
            iVar1 = CheckDirCount((TIFF *)diroff_local,pTStack_40,local_58);
            if (iVar1 == 0) {
              pTStack_40->tdir_ignore = '\x01';
            }
          }
        }
        if (pTStack_40->tdir_ignore == '\0') {
          if (pTStack_40->tdir_tag == 0x9206) {
            iVar1 = TIFFFieldIsAnonymous(_expected);
            if (iVar1 == 0) {
              TIFFFetchSubjectDistance((TIFF *)diroff_local,pTStack_40);
            }
            else {
              TIFFFetchNormalTag((TIFF *)diroff_local,pTStack_40,1);
            }
          }
          else {
            TIFFFetchNormalTag((TIFF *)diroff_local,pTStack_40,1);
          }
        }
      }
      pTStack_40 = pTStack_40 + 1;
    }
    *(undefined4 *)(diroff_local + 0x40) = 1;
    if (pTStack_30 != (TIFFDirEntry *)0x0) {
      _TIFFfreeExt((TIFF *)diroff_local,pTStack_30);
    }
    tif_local._4_4_ = 1;
  }
  return tif_local._4_4_;
}

Assistant:

int TIFFReadCustomDirectory(TIFF *tif, toff_t diroff,
                            const TIFFFieldArray *infoarray)
{
    static const char module[] = "TIFFReadCustomDirectory";
    TIFFDirEntry *dir;
    uint16_t dircount;
    TIFFDirEntry *dp;
    uint16_t di;
    const TIFFField *fip;
    uint32_t fii;
    (*tif->tif_cleanup)(tif); /* cleanup any previous compression state */
    _TIFFSetupFields(tif, infoarray);
    dircount = TIFFFetchDirectory(tif, diroff, &dir, NULL);
    if (!dircount)
    {
        TIFFErrorExtR(tif, module,
                      "Failed to read custom directory at offset %" PRIu64,
                      diroff);
        return 0;
    }
    TIFFFreeDirectory(tif);
    _TIFFmemset(&tif->tif_dir, 0, sizeof(TIFFDirectory));
    TIFFReadDirectoryCheckOrder(tif, dir, dircount);
    for (di = 0, dp = dir; di < dircount; di++, dp++)
    {
        TIFFReadDirectoryFindFieldInfo(tif, dp->tdir_tag, &fii);
        if (fii == FAILED_FII)
        {
            TIFFWarningExtR(tif, module,
                            "Unknown field with tag %" PRIu16 " (0x%" PRIx16
                            ") encountered",
                            dp->tdir_tag, dp->tdir_tag);
            if (!_TIFFMergeFields(
                    tif,
                    _TIFFCreateAnonField(tif, dp->tdir_tag,
                                         (TIFFDataType)dp->tdir_type),
                    1))
            {
                TIFFWarningExtR(tif, module,
                                "Registering anonymous field with tag %" PRIu16
                                " (0x%" PRIx16 ") failed",
                                dp->tdir_tag, dp->tdir_tag);
                dp->tdir_ignore = TRUE;
            }
            else
            {
                TIFFReadDirectoryFindFieldInfo(tif, dp->tdir_tag, &fii);
                assert(fii != FAILED_FII);
            }
        }
        if (!dp->tdir_ignore)
        {
            fip = tif->tif_fields[fii];
            if (fip->field_bit == FIELD_IGNORE)
                dp->tdir_ignore = TRUE;
            else
            {
                /* check data type */
                while ((fip->field_type != TIFF_ANY) &&
                       (fip->field_type != dp->tdir_type))
                {
                    fii++;
                    if ((fii == tif->tif_nfields) ||
                        (tif->tif_fields[fii]->field_tag !=
                         (uint32_t)dp->tdir_tag))
                    {
                        fii = 0xFFFF;
                        break;
                    }
                    fip = tif->tif_fields[fii];
                }
                if (fii == 0xFFFF)
                {
                    TIFFWarningExtR(tif, module,
                                    "Wrong data type %" PRIu16
                                    " for \"%s\"; tag ignored",
                                    dp->tdir_type, fip->field_name);
                    dp->tdir_ignore = TRUE;
                }
                else
                {
                    /* check count if known in advance */
                    if ((fip->field_readcount != TIFF_VARIABLE) &&
                        (fip->field_readcount != TIFF_VARIABLE2))
                    {
                        uint32_t expected;
                        if (fip->field_readcount == TIFF_SPP)
                            expected =
                                (uint32_t)tif->tif_dir.td_samplesperpixel;
                        else
                            expected = (uint32_t)fip->field_readcount;
                        if (!CheckDirCount(tif, dp, expected))
                            dp->tdir_ignore = TRUE;
                    }
                }
            }
            if (!dp->tdir_ignore)
            {
                switch (dp->tdir_tag)
                {
                    case EXIFTAG_SUBJECTDISTANCE:
                        if (!TIFFFieldIsAnonymous(fip))
                        {
                            /* should only be called on a Exif directory */
                            /* when exifFields[] is active */
                            (void)TIFFFetchSubjectDistance(tif, dp);
                        }
                        else
                        {
                            (void)TIFFFetchNormalTag(tif, dp, TRUE);
                        }
                        break;
                    default:
                        (void)TIFFFetchNormalTag(tif, dp, TRUE);
                        break;
                }
            } /*-- if (!dp->tdir_ignore) */
        }
    }
    /* To be able to return from SubIFD or custom-IFD to main-IFD */
    tif->tif_setdirectory_force_absolute = TRUE;
    if (dir)
        _TIFFfreeExt(tif, dir);
    return 1;
}